

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall JetHead::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  int iVar1;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  
  __addr_00 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  __len_00._0_2_ = __addr_00[1].sa_family;
  __len_00._2_1_ = __addr_00[1].sa_data[0];
  __len_00._3_1_ = __addr_00[1].sa_data[1];
  iVar1 = ::connect(this->mFd,__addr_00,__len_00);
  if (iVar1 == 0) {
    setConnected(this,true,1);
  }
  return iVar1;
}

Assistant:

int Socket::connect( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len;
	const struct sockaddr *saddr = addr.getAddr( len );
	int res = ::connect( mFd, saddr, len );

	LOG( "connect to %s on port %d", addr.getName(), addr.getPort() );

	if ( res == 0 )
		setConnected( true );

	return res;
}